

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

void nn_timer_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int timeout;
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  undefined8 uVar4;
  
  uVar3 = (ulong)(uint)src;
  if (*(int *)&self[1].fn == 2) {
    if (src == 1) {
      if (type == 1) {
        timeout = *(int *)&self[2].stopped.fsm;
        if (-1 < timeout) {
          nn_worker_add_timer((nn_worker *)self[2].ctx,timeout,
                              (nn_worker_timer *)&self[1].stopped.src);
          *(undefined4 *)&self[2].stopped.fsm = 0xffffffff;
          return;
        }
        nn_backtrace_print();
        pcVar2 = "timer->timeout >= 0";
        uVar4 = 0x96;
      }
      else {
        nn_backtrace_print();
        pcVar2 = "type == NN_WORKER_TASK_EXECUTE";
        uVar4 = 0x95;
      }
LAB_00129611:
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/timer.c"
              ,uVar4);
      goto LAB_0012961b;
    }
    if (&self[1].stopped.src == (int *)srcptr) {
      if (type == 1) {
        if (*(int *)&self[2].stopped.fsm == -1) {
          nn_fsm_raise(self,(nn_fsm_event *)(self + 2),1);
          return;
        }
        nn_backtrace_print();
        pcVar2 = "timer->timeout == -1";
        uVar4 = 0xa1;
        goto LAB_00129611;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar4 = 0xa6;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected source";
      uVar4 = 0xa9;
    }
  }
  else if (*(int *)&self[1].fn == 1) {
    if (src == -2) {
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        nn_worker_execute((nn_worker *)self[2].ctx,(nn_worker_task *)&self[1].shutdown_fn);
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0x8a;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected source";
      uVar4 = 0x8d;
    }
  }
  else {
    nn_backtrace_print();
    uVar1 = (ulong)*(uint *)&self[1].fn;
    pcVar2 = "Unexpected state";
    uVar4 = 0xaf;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar2,uVar1,uVar3,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/timer.c"
          ,uVar4);
LAB_0012961b:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_timer_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_timer *timer;

    timer = nn_cont (self, struct nn_timer, fsm);

    switch (timer->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_TIMER_STATE_IDLE:
        switch (src) {
        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:

                /*  Send start event to the worker thread. */
                timer->state = NN_TIMER_STATE_ACTIVE;
                nn_worker_execute (timer->worker, &timer->start_task);
                return;
            default:
                nn_fsm_bad_action (timer->state, src, type);
            }
        default:
            nn_fsm_bad_source (timer->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_TIMER_STATE_ACTIVE:
        if (src == NN_TIMER_SRC_START_TASK) {
            nn_assert (type == NN_WORKER_TASK_EXECUTE);
            nn_assert (timer->timeout >= 0);
            nn_worker_add_timer (timer->worker, timer->timeout,
                &timer->wtimer);
            timer->timeout = -1;
            return;
        }
        if (srcptr == &timer->wtimer) {
            switch (type) {
            case NN_WORKER_TIMER_TIMEOUT:

                /*  Notify the user about the timeout. */
                nn_assert (timer->timeout == -1);
                nn_fsm_raise (&timer->fsm, &timer->done, NN_TIMER_TIMEOUT);
                return;

            default:
                nn_fsm_bad_action (timer->state, src, type);
            }
        }
        nn_fsm_bad_source (timer->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (timer->state, src, type);
    }
}